

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::ScopedTrace::~ScopedTrace(ScopedTrace *this)

{
  UnitTest::GetInstance();
  UnitTest::PopGTestTrace(&UnitTest::GetInstance::instance);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(&UnitTest::mutex_) {
  UnitTest::GetInstance()->PopGTestTrace();
}